

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# insert_ordered.h
# Opt level: O2

InsertOrderedSet<wasm::Name> * __thiscall
wasm::InsertOrderedSet<wasm::Name>::operator=
          (InsertOrderedSet<wasm::Name> *this,InsertOrderedSet<wasm::Name> *other)

{
  _List_node_base *p_Var1;
  undefined1 auStack_38 [8];
  Name i;
  
  clear(this);
  p_Var1 = (_List_node_base *)&other->List;
  while (p_Var1 = (((_List_base<wasm::Name,_std::allocator<wasm::Name>_> *)&p_Var1->_M_next)->
                  _M_impl)._M_node.super__List_node_base._M_next,
        p_Var1 != (_List_node_base *)&other->List) {
    auStack_38 = (undefined1  [8])p_Var1[1]._M_next;
    i.super_IString.str._M_len = (size_t)p_Var1[1]._M_prev;
    insert(this,(Name *)auStack_38);
  }
  return this;
}

Assistant:

InsertOrderedSet& operator=(const InsertOrderedSet& other) {
    clear();
    for (auto i : other.List) {
      insert(i); // inserting manually creates proper iterators
    }
    return *this;
  }